

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTSEQDecStart(der_anchor_t *anchor,octet *der,size_t count,u32 tag)

{
  u32 uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  uVar1 = tag;
  do {
    uVar4 = uVar1;
    uVar1 = uVar4 >> 8;
  } while (0xff < uVar4);
  sVar5 = 0xffffffffffffffff;
  if ((uVar4 & 0x20) != 0) {
    anchor->der = der;
    sVar2 = derTDec(&anchor->tag,der,count);
    if ((sVar2 != 0xffffffffffffffff) && (anchor->tag == tag)) {
      sVar3 = derLDec(&anchor->len,der + sVar2,count - sVar2);
      sVar5 = sVar2 + sVar3;
      if (sVar3 == 0xffffffffffffffff) {
        sVar5 = 0xffffffffffffffff;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t derTSEQDecStart(der_anchor_t* anchor, const octet der[], size_t count,
	u32 tag)
{
	size_t t_count;
	size_t l_count;
	// pre
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// проверить тег
	if (!derTIsConstructive(tag))
		return SIZE_MAX;
	// бросить якорь
	anchor->der = der;
	// декодировать тег
	t_count = derTDec(&anchor->tag, der, count);
	if (t_count == SIZE_MAX || anchor->tag != tag)
		return SIZE_MAX;
	// декодировать длину
	l_count = derLDec(&anchor->len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	return t_count + l_count;
}